

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::MultiReporter::assertionEnded(MultiReporter *this,AssertionStats *assertionStats)

{
  pointer puVar1;
  int iVar2;
  char cVar3;
  unique_ptr<Catch::IEventListener> *reporterish;
  pointer puVar4;
  
  cVar3 = '\x01';
  if ((assertionStats->assertionResult).m_resultData.resultType == Ok) {
    iVar2 = (*((this->super_IEventListener).m_config)->_vptr_IConfig[4])();
    cVar3 = (char)iVar2;
  }
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_reporterLikes).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    if ((cVar3 != '\0') || ((puVar4->m_ptr->m_preferences).shouldReportAllAssertions == true)) {
      (*puVar4->m_ptr->_vptr_IEventListener[0xd])(puVar4->m_ptr,assertionStats);
    }
  }
  return;
}

Assistant:

void MultiReporter::assertionEnded( AssertionStats const& assertionStats ) {
        const bool reportByDefault =
            assertionStats.assertionResult.getResultType() != ResultWas::Ok ||
            m_config->includeSuccessfulResults();

        for ( auto & reporterish : m_reporterLikes ) {
            if ( reportByDefault ||
                 reporterish->getPreferences().shouldReportAllAssertions ) {
                    reporterish->assertionEnded( assertionStats );
            }
        }
    }